

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

void sysbvm_type_buildSlotDictionary(sysbvm_context_t *context,sysbvm_tuple_t type)

{
  _Bool _Var1;
  sysbvm_typeSlot_t *initialCapacity;
  sysbvm_tuple_t sVar2;
  sysbvm_typeSlot_t *typeSlot;
  size_t i;
  size_t slotCount;
  sysbvm_type_tuple_t *typeObject;
  sysbvm_tuple_t type_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(type);
  if ((_Var1) &&
     (initialCapacity = (sysbvm_typeSlot_t *)sysbvm_array_getSize(*(sysbvm_tuple_t *)(type + 0x38)),
     initialCapacity != (sysbvm_typeSlot_t *)0x0)) {
    if (*(long *)(type + 0x80) == 0) {
      sVar2 = sysbvm_methodDictionary_createWithCapacity(context,(size_t)initialCapacity);
      *(sysbvm_tuple_t *)(type + 0x80) = sVar2;
    }
    for (typeSlot = (sysbvm_typeSlot_t *)0x0; typeSlot < initialCapacity;
        typeSlot = (sysbvm_typeSlot_t *)((long)&(typeSlot->super).header.field_0 + 1)) {
      sVar2 = sysbvm_array_at(*(sysbvm_tuple_t *)(type + 0x38),(size_t)typeSlot);
      if (*(long *)(sVar2 + 0x10) != 0) {
        sysbvm_methodDictionary_atPut
                  (context,*(sysbvm_tuple_t *)(type + 0x80),*(sysbvm_tuple_t *)(sVar2 + 0x10),sVar2)
        ;
      }
    }
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_buildSlotDictionary(sysbvm_context_t *context, sysbvm_tuple_t type)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;

    sysbvm_type_tuple_t* typeObject = (sysbvm_type_tuple_t*)type;
    size_t slotCount = sysbvm_array_getSize(typeObject->slots);
    if(slotCount == 0) return;

    if(!typeObject->slotDictionary)
        typeObject->slotDictionary = sysbvm_methodDictionary_createWithCapacity(context, slotCount);

    for(size_t i = 0; i < slotCount; ++i)
    {
        sysbvm_typeSlot_t *typeSlot = (sysbvm_typeSlot_t*)sysbvm_array_at(typeObject->slots, i);
        if(typeSlot->super.name)
            sysbvm_methodDictionary_atPut(context, typeObject->slotDictionary, typeSlot->super.name, (sysbvm_tuple_t)typeSlot);
    }
}